

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn.c
# Opt level: O3

int pt_insn_is_vmentry(pt_insn *insn,pt_insn_ext *iext)

{
  if (iext != (pt_insn_ext *)0x0) {
    return (int)(iext->iclass - PTI_INST_VMLAUNCH < 2);
  }
  return 0;
}

Assistant:

int pt_insn_is_vmentry(const struct pt_insn *insn,
		       const struct pt_insn_ext *iext)
{
	(void) insn;

	if (!iext)
		return 0;

	switch (iext->iclass) {
	default:
		return 0;

	case PTI_INST_VMLAUNCH:
	case PTI_INST_VMRESUME:
		return 1;
	}
}